

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hsts.c
# Opt level: O0

CURLcode Curl_hsts_save(Curl_easy *data,hsts *h,char *file)

{
  int iVar1;
  _Bool local_71;
  stsentry *psStack_70;
  _Bool stop;
  stsentry *sts_1;
  curl_index i;
  stsentry *sts;
  char *tempstore;
  FILE *out;
  Curl_llist_element *pCStack_38;
  CURLcode result;
  Curl_llist_element *n;
  Curl_llist_element *e;
  char *file_local;
  hsts *h_local;
  Curl_easy *data_local;
  
  out._4_4_ = CURLE_OK;
  sts = (stsentry *)0x0;
  if (h == (hsts *)0x0) {
    data_local._4_4_ = CURLE_OK;
  }
  else {
    e = (Curl_llist_element *)file;
    if ((file == (char *)0x0) && (h->filename != (char *)0x0)) {
      e = (Curl_llist_element *)h->filename;
    }
    file_local = (char *)h;
    h_local = (hsts *)data;
    if ((((h->flags & 2) == 0) && (e != (Curl_llist_element *)0x0)) && (*(char *)&e->ptr != '\0')) {
      out._4_4_ = Curl_fopen(data,(char *)e,(FILE **)&tempstore,(char **)&sts);
      if (out._4_4_ == CURLE_OK) {
        fputs("# Your HSTS cache. https://curl.se/docs/hsts.html\n# This file was generated by libcurl! Edit at your own risk.\n"
              ,(FILE *)tempstore);
        n = *(Curl_llist_element **)file_local;
        while (n != (Curl_llist_element *)0x0) {
          i.total = (size_t)n->ptr;
          pCStack_38 = n->next;
          out._4_4_ = hsts_out((stsentry *)i.total,(FILE *)tempstore);
          if (out._4_4_ != CURLE_OK) break;
          n = pCStack_38;
        }
        fclose((FILE *)tempstore);
        if (((out._4_4_ == CURLE_OK) && (sts != (stsentry *)0x0)) &&
           (iVar1 = Curl_rename((char *)sts,(char *)e), iVar1 != 0)) {
          out._4_4_ = CURLE_WRITE_ERROR;
        }
        if ((out._4_4_ != CURLE_OK) && (sts != (stsentry *)0x0)) {
          unlink((char *)sts);
        }
      }
      (*Curl_cfree)(sts);
    }
    if (h_local[0xe].list.head != (Curl_llist_element *)0x0) {
      i.index = *(size_t *)(file_local + 0x18);
      sts_1 = (stsentry *)0x0;
      n = *(Curl_llist_element **)file_local;
      while (n != (Curl_llist_element *)0x0) {
        psStack_70 = (stsentry *)n->ptr;
        pCStack_38 = n->next;
        out._4_4_ = hsts_push((Curl_easy *)h_local,(curl_index *)&sts_1,psStack_70,&local_71);
        if ((out._4_4_ != CURLE_OK) || ((local_71 & 1U) != 0)) break;
        sts_1 = (stsentry *)((long)&(sts_1->node).ptr + 1);
        n = pCStack_38;
      }
    }
    data_local._4_4_ = out._4_4_;
  }
  return data_local._4_4_;
}

Assistant:

CURLcode Curl_hsts_save(struct Curl_easy *data, struct hsts *h,
                        const char *file)
{
  struct Curl_llist_element *e;
  struct Curl_llist_element *n;
  CURLcode result = CURLE_OK;
  FILE *out;
  char *tempstore = NULL;

  if(!h)
    /* no cache activated */
    return CURLE_OK;

  /* if no new name is given, use the one we stored from the load */
  if(!file && h->filename)
    file = h->filename;

  if((h->flags & CURLHSTS_READONLYFILE) || !file || !file[0])
    /* marked as read-only, no file or zero length file name */
    goto skipsave;

  result = Curl_fopen(data, file, &out, &tempstore);
  if(!result) {
    fputs("# Your HSTS cache. https://curl.se/docs/hsts.html\n"
          "# This file was generated by libcurl! Edit at your own risk.\n",
          out);
    for(e = h->list.head; e; e = n) {
      struct stsentry *sts = e->ptr;
      n = e->next;
      result = hsts_out(sts, out);
      if(result)
        break;
    }
    fclose(out);
    if(!result && tempstore && Curl_rename(tempstore, file))
      result = CURLE_WRITE_ERROR;

    if(result && tempstore)
      unlink(tempstore);
  }
  free(tempstore);
skipsave:
  if(data->set.hsts_write) {
    /* if there's a write callback */
    struct curl_index i; /* count */
    i.total = h->list.size;
    i.index = 0;
    for(e = h->list.head; e; e = n) {
      struct stsentry *sts = e->ptr;
      bool stop;
      n = e->next;
      result = hsts_push(data, &i, sts, &stop);
      if(result || stop)
        break;
      i.index++;
    }
  }
  return result;
}